

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

void __thiscall icu_63::SimpleTimeZone::decodeStartRule(SimpleTimeZone *this,UErrorCode *status)

{
  char cVar1;
  char cVar2;
  char cVar3;
  EMode EVar4;
  bool bVar5;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    cVar2 = this->startDay;
    bVar5 = this->endDay != '\0';
    this->useDaylight = bVar5 && cVar2 != '\0';
    if (bVar5 && cVar2 != '\0') {
      if (this->dstSavings == 0) {
        this->dstSavings = 3600000;
      }
    }
    else if (cVar2 == '\0') {
      return;
    }
    if (((0xb < (ulong)(byte)this->startMonth) || (86400000 < (uint)this->startTime)) ||
       (UTC_TIME < this->startTimeMode)) goto LAB_0020a54e;
    cVar1 = this->startDayOfWeek;
    if (cVar1 == '\0') {
      this->startMode = DOM_MODE;
    }
    else {
      if (cVar1 < '\x01') {
        cVar3 = -cVar1;
        this->startDayOfWeek = cVar3;
        if (cVar2 < '\x01') {
          cVar2 = -cVar2;
          this->startDay = cVar2;
          EVar4 = DOW_LE_DOM_MODE;
        }
        else {
          EVar4 = DOW_GE_DOM_MODE;
        }
      }
      else {
        EVar4 = DOW_IN_MONTH_MODE;
        cVar3 = cVar1;
      }
      this->startMode = EVar4;
      if ('\a' < cVar3) goto LAB_0020a54e;
      if ('\0' < cVar1) {
        if (0xf4 < (byte)(cVar2 - 6U)) {
          return;
        }
        goto LAB_0020a54e;
      }
    }
    if ((cVar2 < '\x01') || ((char)STATICMONTHLENGTH[(byte)this->startMonth] < cVar2)) {
LAB_0020a54e:
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      return;
    }
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }